

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-server.c
# Opt level: O0

_Bool ssh1_handle_direction_specific_packet(ssh1_connection_state *s,PktIn *pktin)

{
  _Bool _Var1;
  uint keyport;
  uint uVar2;
  uint uVar3;
  PktOut *pPVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  char *pcVar9;
  ssh1_channel *c_00;
  char *pcVar10;
  long lVar11;
  int iVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  byte bVar15;
  ptrlen pVar16;
  undefined8 auStack_bc0 [161];
  uint local_6b8;
  Ssh *local_6a8;
  uint local_69c;
  LogContext *local_698;
  LogContext *local_690;
  LogContext *local_688;
  LogContext *local_680;
  uint local_674;
  LogContext *local_670;
  LogContext *local_668;
  void *local_660;
  Channel *local_658;
  undefined4 local_64c;
  LogContext *local_648;
  LogContext *local_640;
  LogContext *local_638;
  ulong local_630;
  ptrlen local_628;
  ptrlen local_618;
  uint local_604;
  undefined1 auStack_600 [4];
  uint screen_number;
  ptrlen authdata;
  ptrlen authproto;
  size_t local_5d8;
  undefined1 local_5d0 [8];
  ssh_ttymodes modes;
  uint pixheight;
  uint pixwidth;
  uint width;
  uint height;
  ptrlen termtype;
  size_t local_98;
  _Bool local_89;
  _Bool success;
  int listenport;
  int port;
  char *err;
  char *host_str;
  ptrlen data;
  ptrlen cmd;
  ptrlen host;
  uint remid;
  ssh1_channel *c;
  PktOut *pktout;
  PacketProtocolLayer *ppl;
  PktIn *pktin_local;
  ssh1_connection_state *s_local;
  
  bVar15 = 0;
  local_630 = (ulong)(pktin->type - 10);
  switch(local_630) {
  case 0:
    if ((s->finished_setup & 1U) == 0) {
      pVar16 = BinarySource_get_string(pktin->binarysource_);
      uVar7 = BinarySource_get_uint32(pktin->binarysource_);
      uVar8 = BinarySource_get_uint32(pktin->binarysource_);
      uVar5 = BinarySource_get_uint32(pktin->binarysource_);
      uVar6 = BinarySource_get_uint32(pktin->binarysource_);
      modes.mode_val[0x101] = (uint)uVar6;
      read_ttymodes_from_packet((ssh_ttymodes *)local_5d0,pktin->binarysource_,1);
      uVar3 = modes.mode_val[0x101];
      if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
        local_658 = s->mainchan_chan;
        _width = pVar16.ptr;
        local_660 = _width;
        termtype.ptr = (void *)pVar16.len;
        puVar13 = (undefined8 *)local_5d0;
        puVar14 = auStack_bc0;
        local_64c = (int)uVar8;
        for (lVar11 = 0xa1; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar14 = *puVar13;
          puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
          puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
        }
        local_6b8 = modes.mode_val[0xff];
        local_89 = chan_allocate_pty(local_658,local_660,termtype.ptr,local_64c,uVar7 & 0xffffffff,
                                     uVar5 & 0xffffffff,uVar3);
        if (!local_89) {
          local_668 = (s->ppl).logctx;
          pcVar10 = dupprintf("Unable to allocate a pty");
          logevent_and_free(local_668,pcVar10);
        }
      }
      else {
        local_648 = (s->ppl).logctx;
        pcVar10 = dupprintf("Unable to decode pty request packet");
        logevent_and_free(local_648,pcVar10);
        local_89 = false;
      }
      iVar12 = 0xf;
      if (local_89 != false) {
        iVar12 = 0xe;
      }
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,iVar12);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
      return true;
    }
    goto LAB_00144999;
  case 1:
    s_local._7_1_ = true;
    break;
  case 2:
    if ((s->finished_setup & 1U) == 0) {
      local_638 = (s->ppl).logctx;
      pcVar10 = dupprintf("Client requested a shell");
      logevent_and_free(local_638,pcVar10);
      chan_run_shell(s->mainchan_chan);
      s->finished_setup = true;
      return true;
    }
    goto LAB_00144999;
  case 3:
    if ((s->finished_setup & 1U) == 0) {
      pVar16 = BinarySource_get_string(pktin->binarysource_);
      termtype.len = (size_t)pVar16.ptr;
      local_98 = pVar16.len;
      local_640 = (s->ppl).logctx;
      uVar3 = string_length_for_printf(local_98);
      pcVar10 = dupprintf("Client sent command \'%.*s\'",(ulong)uVar3,termtype.len);
      logevent_and_free(local_640,pcVar10);
      chan_run_command(s->mainchan_chan,pVar16);
      s->finished_setup = true;
      return true;
    }
    goto LAB_00144999;
  default:
    s_local._7_1_ = false;
    break;
  case 6:
    local_618 = BinarySource_get_string(pktin->binarysource_);
    chan_send(s->mainchan_chan,false,local_618.ptr,local_618.len);
    s_local._7_1_ = true;
    break;
  case 9:
    chan_send_eof(s->mainchan_chan);
    s_local._7_1_ = true;
    break;
  case 0x12:
    if ((s->finished_setup & 1U) == 0) {
      uVar7 = BinarySource_get_uint32(pktin->binarysource_);
      uVar3 = toint((uint)uVar7);
      pVar16 = BinarySource_get_string(pktin->binarysource_);
      authproto.len = (size_t)pVar16.ptr;
      local_5d8 = pVar16.len;
      uVar7 = BinarySource_get_uint32(pktin->binarysource_);
      keyport = toint((uint)uVar7);
      local_670 = (s->ppl).logctx;
      local_674 = uVar3;
      uVar2 = string_length_for_printf(local_5d8);
      pcVar10 = dupprintf("Client requested port %d forward to %.*s:%d",(ulong)local_674,
                          (ulong)uVar2,authproto.len,(ulong)keyport);
      logevent_and_free(local_670,pcVar10);
      pcVar10 = mkstr(pVar16);
      _Var1 = portfwdmgr_listen(s->portfwdmgr,(char *)0x0,uVar3,pcVar10,keyport,s->conf);
      safefree(pcVar10);
      iVar12 = 0xf;
      if (_Var1) {
        iVar12 = 0xe;
      }
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,iVar12);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
      return true;
    }
    goto LAB_00144999;
  case 0x13:
    uVar7 = BinarySource_get_uint32(pktin->binarysource_);
    pVar16 = BinarySource_get_string(pktin->binarysource_);
    local_628 = pVar16;
    uVar8 = BinarySource_get_uint32(pktin->binarysource_);
    uVar3 = toint((uint)uVar8);
    pcVar10 = mkstr(pVar16);
    local_680 = (s->ppl).logctx;
    pcVar9 = dupprintf("Received request to connect to port %s:%d",pcVar10,(ulong)uVar3);
    logevent_and_free(local_680,pcVar9);
    c_00 = (ssh1_channel *)safemalloc(1,0x38,0);
    c_00->connlayer = s;
    pcVar9 = portfwdmgr_connect(s->portfwdmgr,&c_00->chan,pcVar10,uVar3,&c_00->sc,0);
    safefree(pcVar10);
    if (pcVar9 == (char *)0x0) {
      ssh1_channel_init(c_00);
      c_00->remoteid = (uint)uVar7;
      c_00->halfopen = false;
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0x15);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)c_00->remoteid);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)c_00->localid);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
      local_690 = (s->ppl).logctx;
      pcVar10 = dupprintf("Forwarded port opened successfully");
      logevent_and_free(local_690,pcVar10);
    }
    else {
      local_688 = (s->ppl).logctx;
      pcVar10 = dupprintf("Port open failed: %s",pcVar9);
      logevent_and_free(local_688,pcVar10);
      safefree(pcVar9);
      ssh1_channel_free(c_00);
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0x16);
      BinarySink_put_uint32(pPVar4->binarysink_,uVar7 & 0xffffffff);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
    }
    s_local._7_1_ = true;
    break;
  case 0x14:
    if ((s->finished_setup & 1U) == 0) {
      _Var1 = chan_enable_agent_forwarding(s->mainchan_chan);
      iVar12 = 0xf;
      if (_Var1) {
        iVar12 = 0xe;
      }
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,iVar12);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
      return true;
    }
    goto LAB_00144999;
  case 0x17:
    if ((s->sent_exit_status & 1U) == 0) {
      ssh_proto_error((s->ppl).ssh,
                      "Received SSH1_CMSG_EXIT_CONFIRMATION without having sent SSH1_SMSG_EXIT_STATUS"
                     );
      s_local._7_1_ = true;
    }
    else {
      local_698 = (s->ppl).logctx;
      pcVar10 = dupprintf("Client sent exit confirmation");
      logevent_and_free(local_698,pcVar10);
      s_local._7_1_ = true;
    }
    break;
  case 0x18:
    if ((s->finished_setup & 1U) == 0) {
      join_0x00000010_0x00000000_ = BinarySource_get_string(pktin->binarysource_);
      _auStack_600 = BinarySource_get_string(pktin->binarysource_);
      local_604 = 0;
      if ((s->remote_protoflags & 1U) != 0) {
        uVar7 = BinarySource_get_uint32(pktin->binarysource_);
        local_604 = (uint)uVar7;
      }
      _Var1 = chan_enable_x11_forwarding
                        (s->mainchan_chan,false,stack0xfffffffffffffa10,_auStack_600,local_604);
      iVar12 = 0xf;
      if (_Var1) {
        iVar12 = 0xe;
      }
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,iVar12);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
      return true;
    }
LAB_00144999:
    local_6a8 = (s->ppl).ssh;
    local_69c = pktin->type;
    pcVar10 = ssh1_pkt_type(pktin->type);
    ssh_proto_error(local_6a8,"Received unexpected setup packet after the setup phase, type %d (%s)"
                    ,(ulong)local_69c,pcVar10);
    s_local._7_1_ = true;
    break;
  case 0x1b:
    if (((s->compressing & 1U) == 0) && ((s->ssc->ssh1_allow_compression & 1U) != 0)) {
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0xe);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
      ssh_bpp_handle_output((s->ppl).bpp);
      ssh1_bpp_start_compression((s->ppl).bpp);
      s->compressing = true;
    }
    else {
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0xf);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

bool ssh1_handle_direction_specific_packet(
    struct ssh1_connection_state *s, PktIn *pktin)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    PktOut *pktout;
    struct ssh1_channel *c;
    unsigned remid;
    ptrlen host, cmd, data;
    char *host_str, *err;
    int port, listenport;
    bool success;

    switch (pktin->type) {
      case SSH1_CMSG_EXEC_SHELL:
        if (s->finished_setup)
            goto unexpected_setup_packet;

        ppl_logevent("Client requested a shell");
        chan_run_shell(s->mainchan_chan);
        s->finished_setup = true;
        return true;

      case SSH1_CMSG_EXEC_CMD:
        if (s->finished_setup)
            goto unexpected_setup_packet;

        cmd = get_string(pktin);
        ppl_logevent("Client sent command '%.*s'", PTRLEN_PRINTF(cmd));
        chan_run_command(s->mainchan_chan, cmd);
        s->finished_setup = true;
        return true;

      case SSH1_CMSG_REQUEST_COMPRESSION:
        if (s->compressing || !s->ssc->ssh1_allow_compression) {
            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_FAILURE);
            pq_push(s->ppl.out_pq, pktout);
        } else {
            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_SUCCESS);
            pq_push(s->ppl.out_pq, pktout);
            /* Synchronous run of output formatting, to ensure that
             * success packet is converted into wire format before we
             * start compressing */
            ssh_bpp_handle_output(s->ppl.bpp);
            /* And now ensure that the _next_ packet will be the first
             * compressed one. */
            ssh1_bpp_start_compression(s->ppl.bpp);
            s->compressing = true;
        }

        return true;

      case SSH1_CMSG_REQUEST_PTY: {
        if (s->finished_setup)
            goto unexpected_setup_packet;

        ptrlen termtype = get_string(pktin);
        unsigned height = get_uint32(pktin);
        unsigned width = get_uint32(pktin);
        unsigned pixwidth = get_uint32(pktin);
        unsigned pixheight = get_uint32(pktin);
        struct ssh_ttymodes modes = read_ttymodes_from_packet(
            BinarySource_UPCAST(pktin), 1);

        if (get_err(pktin)) {
          ppl_logevent("Unable to decode pty request packet");
          success = false;
        } else if (!chan_allocate_pty(
                       s->mainchan_chan, termtype, width, height,
                       pixwidth, pixheight, modes)) {
          ppl_logevent("Unable to allocate a pty");
          success = false;
        } else {
          success = true;
        }

        pktout = ssh_bpp_new_pktout(
            s->ppl.bpp, (success ? SSH1_SMSG_SUCCESS : SSH1_SMSG_FAILURE));
        pq_push(s->ppl.out_pq, pktout);
        return true;
      }

      case SSH1_CMSG_PORT_FORWARD_REQUEST:
        if (s->finished_setup)
            goto unexpected_setup_packet;

        listenport = toint(get_uint32(pktin));
        host = get_string(pktin);
        port = toint(get_uint32(pktin));

        ppl_logevent("Client requested port %d forward to %.*s:%d",
                     listenport, PTRLEN_PRINTF(host), port);

        host_str = mkstr(host);
        success = portfwdmgr_listen(
            s->portfwdmgr, NULL, listenport, host_str, port, s->conf);
        sfree(host_str);

        pktout = ssh_bpp_new_pktout(
            s->ppl.bpp, (success ? SSH1_SMSG_SUCCESS : SSH1_SMSG_FAILURE));
        pq_push(s->ppl.out_pq, pktout);
        return true;

      case SSH1_CMSG_X11_REQUEST_FORWARDING: {
        if (s->finished_setup)
            goto unexpected_setup_packet;

        ptrlen authproto = get_string(pktin);
        ptrlen authdata = get_string(pktin);
        unsigned screen_number = 0;
        if (s->remote_protoflags & SSH1_PROTOFLAG_SCREEN_NUMBER)
            screen_number = get_uint32(pktin);

        success = chan_enable_x11_forwarding(
            s->mainchan_chan, false, authproto, authdata, screen_number);

        pktout = ssh_bpp_new_pktout(
            s->ppl.bpp, (success ? SSH1_SMSG_SUCCESS : SSH1_SMSG_FAILURE));
        pq_push(s->ppl.out_pq, pktout);
        return true;
      }

      case SSH1_CMSG_AGENT_REQUEST_FORWARDING:
        if (s->finished_setup)
            goto unexpected_setup_packet;

        success = chan_enable_agent_forwarding(s->mainchan_chan);

        pktout = ssh_bpp_new_pktout(
            s->ppl.bpp, (success ? SSH1_SMSG_SUCCESS : SSH1_SMSG_FAILURE));
        pq_push(s->ppl.out_pq, pktout);
        return true;

      case SSH1_CMSG_STDIN_DATA:
        data = get_string(pktin);
        chan_send(s->mainchan_chan, false, data.ptr, data.len);
        return true;

      case SSH1_CMSG_EOF:
        chan_send_eof(s->mainchan_chan);
        return true;

      case SSH1_CMSG_WINDOW_SIZE:
        return true;

      case SSH1_MSG_PORT_OPEN:
        remid = get_uint32(pktin);
        host = get_string(pktin);
        port = toint(get_uint32(pktin));

        host_str = mkstr(host);

        ppl_logevent("Received request to connect to port %s:%d",
                     host_str, port);
        c = snew(struct ssh1_channel);
        c->connlayer = s;
        err = portfwdmgr_connect(
            s->portfwdmgr, &c->chan, host_str, port,
            &c->sc, ADDRTYPE_UNSPEC);

        sfree(host_str);

        if (err) {
            ppl_logevent("Port open failed: %s", err);
            sfree(err);
            ssh1_channel_free(c);
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_FAILURE);
            put_uint32(pktout, remid);
            pq_push(s->ppl.out_pq, pktout);
        } else {
            ssh1_channel_init(c);
            c->remoteid = remid;
            c->halfopen = false;
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_CONFIRMATION);
            put_uint32(pktout, c->remoteid);
            put_uint32(pktout, c->localid);
            pq_push(s->ppl.out_pq, pktout);
            ppl_logevent("Forwarded port opened successfully");
        }

        return true;

      case SSH1_CMSG_EXIT_CONFIRMATION:
        if (!s->sent_exit_status) {
            ssh_proto_error(s->ppl.ssh, "Received SSH1_CMSG_EXIT_CONFIRMATION"
                            " without having sent SSH1_SMSG_EXIT_STATUS");
            return true;
        }
        ppl_logevent("Client sent exit confirmation");
        return true;

      default:
        return false;
    }

  unexpected_setup_packet:
    ssh_proto_error(s->ppl.ssh, "Received unexpected setup packet after the "
                    "setup phase, type %d (%s)", pktin->type,
                    ssh1_pkt_type(pktin->type));
    /* FIXME: ensure caller copes with us just having freed the whole layer */
    return true;
}